

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void selectrows(void)

{
  int iVar1;
  void *pvVar2;
  char local_112 [8];
  char outfilename [13];
  char infilename [13];
  float density [6];
  long lStack_d8;
  float nullval;
  long irow;
  long noutrows;
  long felem;
  long frow;
  long naxes [2];
  int ii;
  int anynulls;
  int colnum;
  int nfound;
  int keypos;
  int nkeys;
  int hdutype;
  int status;
  char card [81];
  uchar *buffer;
  fitsfile *outfptr;
  fitsfile *infptr;
  
  builtin_strncpy(outfilename + 5,"atestfil",8);
  builtin_strncpy(infilename,".fit",5);
  builtin_strncpy(local_112,"btestfil",8);
  builtin_strncpy(outfilename,".fit",5);
  nkeys = 0;
  iVar1 = ffopentest(10,&outfptr,outfilename + 5,0,&nkeys);
  if ((iVar1 != 0) || (iVar1 = ffopentest(10,&buffer,local_112,1,&nkeys), iVar1 != 0)) {
    printerror(nkeys);
  }
  iVar1 = ffmahd(outfptr,3,&keypos,&nkeys);
  if (iVar1 != 0) {
    printerror(nkeys);
  }
  if (keypos == 2) {
    iVar1 = ffmahd(buffer,2,&keypos,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    iVar1 = ffcrhd(buffer,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    iVar1 = ffghps(outfptr,&nfound,&colnum,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    for (naxes[1]._0_4_ = 1; (int)naxes[1] <= nfound; naxes[1]._0_4_ = (int)naxes[1] + 1) {
      ffgrec(outfptr,(int)naxes[1],&hdutype,&nkeys);
      ffprec(buffer,&hdutype,&nkeys);
    }
    iVar1 = ffgknj(outfptr,"NAXIS",1,2,&frow,&anynulls,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    iVar1 = ffgcno(outfptr,0,"density",&ii,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    felem = 1;
    noutrows = 1;
    density[5] = -99.0;
    iVar1 = ffgcv(outfptr,0x2a,ii,1,1,naxes[0],density + 5,infilename + 5,(long)naxes + 0xc,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    pvVar2 = malloc(frow);
    irow = 0;
    for (lStack_d8 = 1; lStack_d8 <= naxes[0]; lStack_d8 = lStack_d8 + 1) {
      if (density[lStack_d8 + -3] < 3.0) {
        irow = irow + 1;
        ffgtbb(outfptr,lStack_d8,1,frow,pvVar2,&nkeys);
        ffptbb(buffer,irow,1,frow,pvVar2,&nkeys);
      }
    }
    iVar1 = ffuky(buffer,0x29,"NAXIS2",&irow,0,&nkeys);
    if (iVar1 != 0) {
      printerror(nkeys);
    }
    iVar1 = ffclos(buffer,&nkeys);
    if ((iVar1 != 0) || (iVar1 = ffclos(outfptr,&nkeys), iVar1 != 0)) {
      printerror(nkeys);
    }
  }
  else {
    printf("Error: expected to find a binary table in this HDU\n");
  }
  return;
}

Assistant:

void selectrows( void )

    /*********************************************************************/
    /* select rows from an input table and copy them to the output table */
    /*********************************************************************/
{
    fitsfile *infptr, *outfptr;  /* pointer to input and output FITS files */
    unsigned char *buffer;
    char card[FLEN_CARD];
    int status, hdutype, nkeys, keypos, nfound, colnum, anynulls, ii;
    long naxes[2], frow, felem, noutrows, irow;
    float nullval, density[6];

    char infilename[]  = "atestfil.fit";  /* name for existing FITS file   */
    char outfilename[] = "btestfil.fit";  /* name for new FITS file        */

    status = 0;

    /* open the existing FITS files */
    if ( fits_open_file(&infptr,  infilename,  READONLY,  &status) ||
         fits_open_file(&outfptr, outfilename, READWRITE, &status) ) 
         printerror( status );

    /* move to the 3rd HDU in the input file (a binary table in this case) */
    if ( fits_movabs_hdu(infptr, 3, &hdutype, &status) )
         printerror( status );

    if (hdutype != BINARY_TBL)  {
        printf("Error: expected to find a binary table in this HDU\n");
        return;
    }
    /* move to the last (2rd) HDU in the output file */
    if ( fits_movabs_hdu(outfptr, 2, &hdutype, &status) )
         printerror( status );

    /* create new extension in the output file */
    if ( fits_create_hdu(outfptr, &status) )
         printerror( status );

    /* get number of keywords */
    if ( fits_get_hdrpos(infptr, &nkeys, &keypos, &status) ) 
         printerror( status );

    /* copy all the keywords from the input to the output extension */
    for (ii = 1; ii <= nkeys; ii++)  {
        fits_read_record (infptr, ii, card, &status); 
        fits_write_record(outfptr,    card, &status); 
    }

    /* read the NAXIS1 and NAXIS2 keyword to get table size */
    if (fits_read_keys_lng(infptr, "NAXIS", 1, 2, naxes, &nfound, &status) )
         printerror( status );

    /* find which column contains the DENSITY values */
    if ( fits_get_colnum(infptr, CASEINSEN, "density", &colnum, &status) )
         printerror( status );

    /* read the DENSITY column values */
    frow = 1;
    felem = 1;
    nullval = -99.;
    if (fits_read_col(infptr, TFLOAT, colnum, frow, felem, naxes[1], 
        &nullval, density, &anynulls, &status) )
        printerror( status );

    /* allocate buffer large enough for 1 row of the table */
    buffer = (unsigned char *) malloc(naxes[0]);

    /* If the density is less than 3.0, copy the row to the output table */
    for (noutrows = 0, irow = 1; irow <= naxes[1]; irow++)  {
      if (density[irow - 1] < 3.0)  {
        noutrows++;
        fits_read_tblbytes( infptr, irow,      1, naxes[0], buffer, &status); 
        fits_write_tblbytes(outfptr, noutrows, 1, naxes[0], buffer, &status); 
    } }

    /* update the NAXIS2 keyword with the correct number of rows */
    if ( fits_update_key(outfptr, TLONG, "NAXIS2", &noutrows, 0, &status) )
         printerror( status );

    if (fits_close_file(outfptr, &status) || fits_close_file(infptr, &status))
        printerror( status );

    return;
}